

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O2

activity_stats_t * __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
::take_stats(activity_stats_t *__return_storage_ptr__,
            stats_collector_t<so_5::stats::activity_tracking_stuff::external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>_>
            *this)

{
  time_point activity_started_at;
  rep rVar1;
  
  external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
  ::lock(&this->
          super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
        );
  (__return_storage_ptr__->m_avg_time).__r = (this->m_work_activity).m_avg_time.__r;
  rVar1 = (this->m_work_activity).m_total_time.__r;
  __return_storage_ptr__->m_count = (this->m_work_activity).m_count;
  (__return_storage_ptr__->m_total_time).__r = rVar1;
  if (this->m_is_in_working == true) {
    activity_started_at.__d.__r = (duration)(this->m_work_started_at).__d.__r;
    (((this->
      super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
      ).m_lock)->m_flag).super___atomic_flag_base._M_i = false;
    details::update_stats_from_current_time(__return_storage_ptr__,activity_started_at);
  }
  else {
    (((this->
      super_external_lock<so_5::spinlock_t<so_5::yield_backoff_t>,_so_5::stats::activity_tracking_stuff::default_lock_policy>
      ).m_lock)->m_flag).super___atomic_flag_base._M_i = false;
  }
  return __return_storage_ptr__;
}

Assistant:

so_5::stats::activity_stats_t
		take_stats()
			{
				so_5::stats::activity_stats_t result;
				bool is_in_working{ false };
				so_5::stats::clock_type_t::time_point work_started_at;

				{
					typename LOCK_HOLDER::take_stats_lock_t lock{ lock_holder() };

					result = m_work_activity;
					if( true == (is_in_working = m_is_in_working) )
						work_started_at = m_work_started_at;
				}

				if( is_in_working )
					so_5::stats::details::update_stats_from_current_time(
							result,
							work_started_at );

				return result;
			}